

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void cs_impl::fiber::destroy(routine_t id)

{
  long lVar1;
  Routine *this;
  _List_node_base *p_Var2;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  if (*(char *)(lVar1 + -8) == '\0') {
    *(undefined1 *)(lVar1 + -8) = 1;
    __cxx_global_var_init_7();
  }
  this = *(Routine **)(*(long *)(lVar1 + -0x410) + (ulong)(id - 1) * 8);
  if (this != (Routine *)0x0) {
    Routine::~Routine(this);
    operator_delete(this,0x438);
    if (*(char *)(lVar1 + -8) == '\0') {
      destroy();
    }
    else {
      *(undefined8 *)(*(long *)(lVar1 + -0x410) + (ulong)(id - 1) * 8) = 0;
    }
    p_Var2 = (_List_node_base *)operator_new(0x18);
    *(routine_t *)&p_Var2[1]._M_next = id;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    *(long *)(lVar1 + -1000) = *(long *)(lVar1 + -1000) + 1;
    return;
  }
  __assert_fail("routine != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                ,0x140,"void cs_impl::fiber::destroy(routine_t)");
}

Assistant:

void destroy(routine_t id)
		{
			Routine *routine = ordinator.routines[id - 1];
			assert(routine != nullptr);

			delete routine;
			ordinator.routines[id - 1] = nullptr;
			ordinator.indexes.push_back(id);
		}